

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

const_iterator * __thiscall
QMultiHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
          (const_iterator *__return_storage_ptr__,QMultiHash<QByteArray,_QByteArray> *this,
          QByteArray *key)

{
  Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this_00;
  Span *pSVar1;
  size_t hash;
  ulong uVar2;
  Bucket BVar3;
  QByteArrayView key_00;
  
  if (this->m_size != 0) {
    this_00 = this->d;
    key_00.m_data = (key->d).ptr;
    key_00.m_size = (key->d).size;
    hash = qHash(key_00,this_00->seed);
    BVar3 = QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::
            findBucketWithHash<QByteArray>(this_00,key,hash);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pSVar1 = this->d->spans;
      uVar2 = ((ulong)((long)BVar3.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
      (__return_storage_ptr__->i).d = this->d;
      (__return_storage_ptr__->i).bucket = uVar2;
      uVar2 = uVar2 >> 7;
      __return_storage_ptr__->e =
           (Chain **)
           (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)BVar3.index & 0x7f]].storage.data +
           0x18);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *)0x0;
  (__return_storage_ptr__->i).bucket = 0;
  __return_storage_ptr__->e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }